

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::Ok> *
wasm::WATParser::makeSIMDLoadStoreLane<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,SIMDLoadStoreLaneOp op,int bytes)

{
  Lexer *this;
  undefined8 *puVar1;
  optional<unsigned_char> oVar2;
  optional<unsigned_int> oVar3;
  Memarg *mem_00;
  uint32_t align;
  _Storage<unsigned_int,_true> _Var4;
  Memarg *__rhs;
  optional<unsigned_long> oVar5;
  undefined1 local_130 [8];
  MaybeResult<wasm::Name> mem;
  Result<wasm::WATParser::Memarg> arg;
  size_t reset;
  undefined8 local_d0;
  pointer local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [8];
  anon_class_48_6_2b818c79 retry;
  Result<wasm::WATParser::Memarg> _val;
  Index local_3c;
  SIMDLoadStoreLaneOp local_38;
  Index pos_local;
  SIMDLoadStoreLaneOp op_local;
  int bytes_local;
  
  retry.bytes = (int *)&local_3c;
  retry.annotations =
       (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
       &local_38;
  retry.reset = (size_t *)&pos_local;
  arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._32_8_ = (ctx->in).pos;
  retry.ctx = (ParseDefsCtx *)
              ((long)&arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20);
  local_b8 = (undefined1  [8])ctx;
  retry.pos = (Index *)annotations;
  local_3c = pos;
  local_38 = op;
  pos_local = bytes;
  maybeMemidx<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Name> *)local_130,ctx);
  _Var4 = (_Storage<unsigned_int,_true>)pos_local;
  if (mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
    makeSIMDLoadStoreLane<wasm::WATParser::ParseDefsCtx>::anon_class_48_6_2b818c79::operator()
              (__return_storage_ptr__,(anon_class_48_6_2b818c79 *)local_b8);
  }
  else {
    this = &ctx->in;
    oVar5 = Lexer::takeOffset(this);
    oVar3 = Lexer::takeAlign(this);
    mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ = 0;
    if (((undefined1  [16])
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ =
           oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
    }
    if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
      _Var4._M_value =
           oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
    }
    __rhs = (Memarg *)
            ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20);
    arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._24_1_ = 0;
    arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._M_first._M_storage.offset
    ._0_4_ = _Var4;
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::Memarg,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::Memarg,_wasm::Err> *)&retry.op,
                    (_Copy_ctor_base<false,_wasm::WATParser::Memarg,_wasm::Err> *)__rhs);
    if (_val.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._24_1_ == '\x01') {
      reset = (size_t)&local_c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&reset,retry.op,
                 _val.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._M_first.
                 _M_storage.offset + (long)retry.op);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
      if ((pointer *)reset == &local_c8) {
        *puVar1 = local_c8;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_c0;
      }
      else {
        *(size_t *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = reset;
        *(pointer *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_c8;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_d0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err> *)&retry.op);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err> *)&retry.op);
      oVar2 = Lexer::takeU<unsigned_char>(this);
      if (((ushort)oVar2.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_char> >> 8 & 1) == 0) {
        makeSIMDLoadStoreLane<wasm::WATParser::ParseDefsCtx>::anon_class_48_6_2b818c79::operator()
                  (__return_storage_ptr__,(anon_class_48_6_2b818c79 *)local_b8);
      }
      else {
        mem_00 = (Memarg *)local_130;
        if (mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ != '\0') {
          mem_00 = (Memarg *)0x0;
        }
        if (arg.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::Memarg,_wasm::Err>._M_u._24_1_ != '\0') {
          __rhs = (Memarg *)0x0;
        }
        ParseDefsCtx::makeSIMDLoadStoreLane
                  (__return_storage_ptr__,ctx,local_3c,annotations,local_38,(Name *)mem_00,*__rhs,
                   oVar2.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_char>._M_payload);
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::Memarg,_wasm::Err> *)
                      ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_130);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeSIMDLoadStoreLane(Ctx& ctx,
                               Index pos,
                               const std::vector<Annotation>& annotations,
                               SIMDLoadStoreLaneOp op,
                               int bytes) {
  auto reset = ctx.in.getPos();

  auto retry = [&]() -> Result<> {
    // We failed to parse. Maybe the lane index was accidentally parsed as the
    // optional memory index. Try again without parsing a memory index.
    WithPosition with(ctx, reset);
    auto arg = memarg(ctx, bytes);
    CHECK_ERR(arg);
    auto lane = ctx.in.takeU8();
    if (!lane) {
      return ctx.in.err("expected lane index");
    }
    return ctx.makeSIMDLoadStoreLane(
      pos, annotations, op, nullptr, *arg, *lane);
  };

  auto mem = maybeMemidx(ctx);
  if (mem.getErr()) {
    return retry();
  }
  auto arg = memarg(ctx, bytes);
  CHECK_ERR(arg);
  auto lane = ctx.in.takeU8();
  if (!lane) {
    return retry();
  }
  return ctx.makeSIMDLoadStoreLane(
    pos, annotations, op, mem.getPtr(), *arg, *lane);
}